

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamlogger.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ILogger *t;
  StreamLogger *this;
  _func_ostream_ptr_ostream_ptr *in_stack_00000058;
  StreamLogger *in_stack_00000060;
  LogType in_stack_ffffffffffffffe0;
  LogType LVar1;
  undefined4 in_stack_ffffffffffffffe4;
  
  t = (ILogger *)operator_new(8);
  liblogger::LogStdout::LogStdout
            ((LogStdout *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  liblogger::LogManager::Add(t);
  this = (StreamLogger *)liblogger::GetStreamLogger();
  LVar1 = LOGGER_INFO;
  liblogger::StreamLogger::operator<<(this,(LogType *)&stack0xffffffffffffffe0);
  liblogger::StreamLogger::operator<<
            ((StreamLogger *)CONCAT44(in_stack_ffffffffffffffe4,LVar1),(char (*) [18])t);
  liblogger::StreamLogger::operator<<(in_stack_00000060,in_stack_00000058);
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogStdout());

	LOGGER << LOGGER_INFO << "Test StreamLogger" << std::endl;

	LogManager::RemoveAll();
	return 0;
}